

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecStr.h
# Opt level: O1

void Vec_StrPutS(Vec_Str_t *vOut,char *pStr)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  char cVar4;
  char *pcVar5;
  size_t sVar6;
  
  cVar4 = *pStr;
  if (cVar4 != '\0') {
    pcVar5 = pStr + 1;
    do {
      uVar1 = vOut->nCap;
      if (vOut->nSize == uVar1) {
        if ((int)uVar1 < 0x10) {
          if (vOut->pArray == (char *)0x0) {
            pcVar3 = (char *)malloc(0x10);
          }
          else {
            pcVar3 = (char *)realloc(vOut->pArray,0x10);
          }
          vOut->pArray = pcVar3;
          sVar6 = 0x10;
        }
        else {
          sVar6 = (ulong)uVar1 * 2;
          if ((int)sVar6 <= (int)uVar1) goto LAB_003d898e;
          if (vOut->pArray == (char *)0x0) {
            pcVar3 = (char *)malloc(sVar6);
          }
          else {
            pcVar3 = (char *)realloc(vOut->pArray,sVar6);
          }
          vOut->pArray = pcVar3;
        }
        vOut->nCap = (int)sVar6;
      }
LAB_003d898e:
      iVar2 = vOut->nSize;
      vOut->nSize = iVar2 + 1;
      vOut->pArray[iVar2] = cVar4;
      cVar4 = *pcVar5;
      pcVar5 = pcVar5 + 1;
    } while (cVar4 != '\0');
  }
  uVar1 = vOut->nCap;
  if (vOut->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vOut->pArray == (char *)0x0) {
        pcVar5 = (char *)malloc(0x10);
      }
      else {
        pcVar5 = (char *)realloc(vOut->pArray,0x10);
      }
      vOut->pArray = pcVar5;
      sVar6 = 0x10;
    }
    else {
      sVar6 = (ulong)uVar1 * 2;
      if ((int)sVar6 <= (int)uVar1) goto LAB_003d8a16;
      if (vOut->pArray == (char *)0x0) {
        pcVar5 = (char *)malloc(sVar6);
      }
      else {
        pcVar5 = (char *)realloc(vOut->pArray,sVar6);
      }
      vOut->pArray = pcVar5;
    }
    vOut->nCap = (int)sVar6;
  }
LAB_003d8a16:
  iVar2 = vOut->nSize;
  vOut->nSize = iVar2 + 1;
  vOut->pArray[iVar2] = '\0';
  return;
}

Assistant:

static inline void Vec_StrPutS( Vec_Str_t * vOut, char * pStr )
{
    while ( *pStr )
        Vec_StrPush( vOut, *pStr++ );
    Vec_StrPush( vOut, (char)0 );
}